

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::chooseRow(HEkkPrimal *this)

{
  int iVar1;
  uint uVar2;
  HEkk *pHVar3;
  pointer piVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pHVar3 = this->ekk_instance_;
  uVar6 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x27,0);
  this->row_out = -1;
  iVar1 = (pHVar3->info_).update_count;
  if (iVar1 < 10) {
    dVar10 = 1e-09;
  }
  else {
    dVar10 = *(double *)(&DAT_003b0f10 + (ulong)(iVar1 < 0x14) * 8);
  }
  uVar2 = (this->col_aq).count;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar6;
  }
  dVar11 = 1e+100;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    dVar8 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1] * (double)this->move_in;
    if (dVar8 <= dVar10) {
      if ((dVar8 < -dVar10) &&
         (dVar9 = ((pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar1] -
                  (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar1]) -
                  this->primal_feasibility_tolerance, dVar11 * dVar8 < dVar9)) goto LAB_003460a6;
    }
    else {
      dVar9 = ((pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar1] -
              (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar1]) + this->primal_feasibility_tolerance;
      if (dVar9 < dVar11 * dVar8) {
LAB_003460a6:
        dVar11 = dVar9 / dVar8;
      }
    }
  }
  uVar7 = 0;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x27,0);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x28,0);
  uVar2 = (this->col_aq).count;
  piVar4 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar7;
  }
  dVar8 = 0.0;
  do {
    if (uVar6 == uVar7) {
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x28,0);
      return;
    }
    iVar1 = piVar4[uVar7];
    dVar9 = pdVar5[iVar1] * (double)this->move_in;
    if (dVar9 <= dVar10) {
      if ((dVar9 < -dVar10) &&
         (dVar11 * dVar9 <
          (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] -
          (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1])) {
        dVar9 = -dVar9;
        goto LAB_003461a2;
      }
    }
    else if ((pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1] -
             (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1] < dVar11 * dVar9) {
LAB_003461a2:
      if (dVar8 < dVar9) {
        this->row_out = iVar1;
        dVar8 = dVar9;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void HEkkPrimal::chooseRow() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Initialize
  row_out = kNoRowChosen;

  // Choose row pass 1
  double alphaTol = info.update_count < 10   ? 1e-9
                    : info.update_count < 20 ? 1e-8
                                             : 1e-7;

  double relaxTheta = 1e100;
  double relaxSpace;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance;
      if (relaxSpace < relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    } else if (alpha < -alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance;
      if (relaxSpace > relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    }
  }
  analysis->simplexTimerStop(Chuzr1Clock);

  analysis->simplexTimerStart(Chuzr2Clock);
  double bestAlpha = 0;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      // Positive pivotal column entry
      double tightSpace = baseValue[iRow] - baseLower[iRow];
      if (tightSpace < relaxTheta * alpha) {
        if (bestAlpha < alpha) {
          bestAlpha = alpha;
          row_out = iRow;
        }
      }
    } else if (alpha < -alphaTol) {
      // Negative pivotal column entry
      double tightSpace = baseValue[iRow] - baseUpper[iRow];
      if (tightSpace > relaxTheta * alpha) {
        if (bestAlpha < -alpha) {
          bestAlpha = -alpha;
          row_out = iRow;
        }
      }
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}